

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

void __thiscall
Js::DynamicProfileInfo::RecordParameterAtCallSite
          (DynamicProfileInfo *this,FunctionBody *functionBody,ProfileId callSiteId,Var arg,
          int argNum,RegSlot regSlot)

{
  byte bVar1;
  code *pcVar2;
  ProfileId callSiteId_00;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  CallbackInfo *pCVar6;
  JavascriptFunction *pJVar7;
  CallSiteInfo *pCVar8;
  uint uVar9;
  undefined6 in_register_00000012;
  FunctionBody *this_00;
  Type local_54;
  DynamicProfileInfo *pDStack_50;
  SourceId sourceId;
  Type local_48;
  RegSlot local_44;
  LocalFunctionId functionId;
  undefined4 uStack_3c;
  int local_34;
  
  _functionId = CONCAT44(uStack_3c,(int)CONCAT62(in_register_00000012,callSiteId));
  local_44 = regSlot;
  if ((this->persistsAcrossScriptContexts == false) && ((this->functionBody).ptr != functionBody)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1ac,
                                "(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody)"
                                ,
                                "!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody"
                               );
    if (!bVar3) goto LAB_009713d5;
    *puVar5 = 0;
  }
  if (0xe < (uint)argNum) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1af,"(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount)",
                                "argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount");
    if (!bVar3) goto LAB_009713d5;
    *puVar5 = 0;
  }
  if (functionBody->profiledCallSiteCount <= (ushort)_functionId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x1b0,"(callSiteId < functionBody->GetProfiledCallSiteCount())",
                                "callSiteId < functionBody->GetProfiledCallSiteCount()");
    if (!bVar3) goto LAB_009713d5;
    *puVar5 = 0;
  }
  this_00 = functionBody;
  pDStack_50 = this;
  bVar3 = PhaseIsEnabled::InlineCallbacksPhase<Js::FunctionBody*>(functionBody);
  local_34 = argNum;
  if (bVar3) {
    if ((arg < &DAT_1000000000000 && arg != (Var)0x0) &&
       (this_00 = (FunctionBody *)arg,
       bVar3 = VarIsImpl<Js::JavascriptFunction>((RecyclableObject *)arg), bVar3)) {
      pCVar6 = EnsureCallbackInfo((DynamicProfileInfo *)this_00,functionBody,(ProfileId)functionId);
      if (pCVar6->sourceId == 0xffffffff) {
        pJVar7 = UnsafeVarTo<Js::JavascriptFunction>(arg);
        GetSourceAndFunctionId
                  (functionBody,(pJVar7->functionInfo).ptr,pJVar7,&pCVar6->sourceId,
                   &pCVar6->functionId);
        *(byte *)pCVar6 = *(byte *)pCVar6 & 0x83 | ((byte)argNum & 0x1f) << 2;
        return;
      }
      bVar1 = *(byte *)pCVar6;
      if ((bVar1 & 1) == 0) {
        return;
      }
      if ((bVar1 >> 2 & 0x1f) != argNum) {
        *(byte *)pCVar6 = bVar1 & 0xfe;
        return;
      }
      if ((bVar1 & 2) != 0) {
        return;
      }
      pJVar7 = UnsafeVarTo<Js::JavascriptFunction>(arg);
      GetSourceAndFunctionId(functionBody,(pJVar7->functionInfo).ptr,pJVar7,&local_54,&local_48);
      if ((local_54 == pCVar6->sourceId) && (local_48 == pCVar6->functionId)) {
        return;
      }
      *(byte *)pCVar6 = *(byte *)pCVar6 | 2;
      return;
    }
    callSiteId_00 = (ProfileId)functionId;
    _functionId = _functionId & 0xffff;
    pCVar6 = FindCallbackInfo((DynamicProfileInfo *)this_00,functionBody,callSiteId_00);
    if ((pCVar6 != (CallbackInfo *)0x0) && ((*(uint *)pCVar6 >> 2 & 0x1f) == argNum)) {
      *(byte *)pCVar6 = (byte)*(uint *)pCVar6 & 0xfe;
    }
    if (((ulong)arg & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_009713d5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    if (((ulong)arg & 0xffff000000000000) != 0x1000000000000) {
      return;
    }
    uVar4 = FunctionBody::GetCountField(functionBody,ConstantCount);
    if (uVar4 <= local_44) {
      return;
    }
    pCVar8 = (pDStack_50->callSiteInfo).ptr;
    uVar9 = (uint)_functionId;
  }
  else {
    if (((ulong)arg & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)arg & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_009713d5;
      *puVar5 = 0;
    }
    if (((ulong)arg & 0xffff000000000000) != 0x1000000000000) {
      return;
    }
    uVar4 = FunctionBody::GetCountField(functionBody,ConstantCount);
    if (uVar4 <= local_44) {
      return;
    }
    pCVar8 = (pDStack_50->callSiteInfo).ptr;
    uVar9 = (uint)(ProfileId)functionId;
  }
  *(ushort *)(&pCVar8->field_0x2 + (uVar9 << 4)) =
       *(ushort *)(&pCVar8->field_0x2 + (uVar9 << 4)) |
       (ushort)(1 << ((byte)local_34 & 0x1f)) & 0x1fff;
  return;
}

Assistant:

void DynamicProfileInfo::RecordParameterAtCallSite(FunctionBody * functionBody, ProfileId callSiteId, Var arg, int argNum, Js::RegSlot regSlot)
    {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
        // If we persistsAcrossScriptContext, the dynamic profile info may be referred to by multiple function body from
        // different script context
        Assert(!DynamicProfileInfo::NeedProfileInfoList() || this->persistsAcrossScriptContexts || this->functionBody == functionBody);
#endif

        Assert(argNum < Js::InlineeCallInfo::MaxInlineeArgoutCount);
        Assert(callSiteId < functionBody->GetProfiledCallSiteCount());

        if (!PHASE_ENABLED(InlineCallbacksPhase, functionBody))
        {
            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
            return;
        }

        if (arg != nullptr && VarIs<RecyclableObject>(arg) && VarIs<JavascriptFunction>(arg))
        {
            CallbackInfo * callbackInfo = EnsureCallbackInfo(functionBody, callSiteId);
            if (callbackInfo->sourceId == NoSourceId)
            {
                JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &callbackInfo->sourceId, &callbackInfo->functionId);
                callbackInfo->argNumber = argNum;
            }
            else if (callbackInfo->canInlineCallback)
            {
                if (argNum != callbackInfo->argNumber)
                {
                    callbackInfo->canInlineCallback = false;
                }
                else if (!callbackInfo->isPolymorphic)
                {
                    Js::SourceId sourceId;
                    Js::LocalFunctionId functionId;
                    JavascriptFunction * callback = UnsafeVarTo<JavascriptFunction>(arg);
                    GetSourceAndFunctionId(functionBody, callback->GetFunctionInfo(), callback, &sourceId, &functionId);

                    if (sourceId != callbackInfo->sourceId || functionId != callbackInfo->functionId)
                    {
                        callbackInfo->isPolymorphic = true;
                    }
                }
            }
        }
        else
        {
            CallbackInfo * callbackInfo = FindCallbackInfo(functionBody, callSiteId);
            if (callbackInfo != nullptr && callbackInfo->argNumber == argNum)
            {
                callbackInfo->canInlineCallback = false;
            }

            if (TaggedInt::Is(arg) && regSlot < functionBody->GetConstantCount())
            {
                callSiteInfo[callSiteId].isArgConstant = callSiteInfo[callSiteId].isArgConstant | (1 << argNum);
            }
        }
    }